

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall
SmallVector_CtorInitializerList2_Test::TestBody(SmallVector_CtorInitializerList2_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int,_int>_> matcher;
  initializer_list<int> init;
  bool bVar1;
  char *message;
  undefined8 in_stack_ffffffffffffff28;
  AssertHelper local_c0;
  Message local_b8 [3];
  int local_a0 [4];
  testing local_90 [8];
  _Tuple_impl<2UL,_int,_int> _Stack_88;
  char local_80 [16];
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  small_vector<int,_2UL> b;
  SmallVector_CtorInitializerList2_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 2;
  init._M_len = 4;
  init._M_array = (iterator)&gtest_ar.message_;
  b.buffer_ = (int *)this;
  pstore::small_vector<int,_2UL>::small_vector((small_vector<int,_2UL> *)local_40,init);
  local_a0[3] = 1;
  local_a0[2] = 2;
  local_a0[1] = 3;
  local_a0[0] = 4;
  testing::ElementsAre<int,int,int,int>(local_90,local_a0 + 3,local_a0 + 2,local_a0 + 1,local_a0);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
  .super__Head_base<1UL,_int,_false>._M_head_impl = (int)in_stack_ffffffffffffff28;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
  .super__Tuple_impl<2UL,_int,_int> = _Stack_88;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_70,local_80,(small_vector<int,_2UL> *)0x2bee83);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x3d,message);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pstore::small_vector<int,_2UL>::~small_vector((small_vector<int,_2UL> *)local_40);
  return;
}

Assistant:

TEST (SmallVector, CtorInitializerList2) {
    pstore::small_vector<int, 2> b{1, 2, 3, 4};
    EXPECT_THAT (b, ::testing::ElementsAre (1, 2, 3, 4));
}